

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::clearFocus(QWidget *this)

{
  bool bVar1;
  QTLWExtra *pQVar2;
  QWidgetPrivate *pQVar3;
  QWidget *pQVar4;
  pointer pQVar5;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *topData;
  QWidget *w;
  QObject *originalFocusObject;
  QTLWExtra *extra;
  QAccessibleEvent event;
  QFocusEvent focusAboutToChange;
  QWidgetPrivate *in_stack_ffffffffffffff80;
  QWidgetWindow *pQVar6;
  FocusReason reason;
  QWidget *in_stack_ffffffffffffff88;
  QWidget *in_stack_ffffffffffffff98;
  QWidget *local_60;
  QWidget *local_58;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = hasFocus(in_stack_ffffffffffffff98);
  if (bVar1) {
    bVar1 = testAttribute(in_stack_ffffffffffffff88,
                          (WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    if (bVar1) {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
    }
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusAboutToChange,OtherFocusReason);
    QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&local_20);
    QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
  }
  window(in_RDI);
  d_func((QWidget *)0x3624db);
  pQVar2 = QWidgetPrivate::maybeTopData(in_stack_ffffffffffffff80);
  local_58 = (QWidget *)0x0;
  local_60 = in_RDI;
  if (((pQVar2 != (QTLWExtra *)0x0) && (pQVar2->window != (QWidgetWindow *)0x0)) &&
     (local_58 = (QWidget *)(**(code **)(*(long *)pQVar2->window + 0x80))(), local_60 = in_RDI,
     local_58 == (QWidget *)0x0)) {
    local_58 = focusWidget((QWidget *)0x36252e);
    local_60 = in_RDI;
  }
  while (reason = (FocusReason)((ulong)in_stack_ffffffffffffff80 >> 0x20),
        local_60 != (QWidget *)0x0) {
    pQVar3 = d_func((QWidget *)0x362551);
    if (pQVar3->focus_child == in_RDI) {
      pQVar3 = d_func((QWidget *)0x362569);
      pQVar3->focus_child = (QWidget *)0x0;
    }
    local_60 = parentWidget((QWidget *)0x36257e);
  }
  if ((local_58 != (QWidget *)0x0) &&
     (pQVar4 = (QWidget *)(**(code **)(*(long *)pQVar2->window + 0x80))(),
     in_stack_ffffffffffffff88 = local_58, local_58 != pQVar4)) {
    pQVar6 = pQVar2->window;
    (**(code **)(*(long *)pQVar2->window + 0x80))();
    QWindow::focusObjectChanged((QObject *)pQVar6);
    reason = (FocusReason)((ulong)pQVar6 >> 0x20);
    in_stack_ffffffffffffff88 = local_58;
  }
  pQVar3 = d_func((QWidget *)0x3625fc);
  pQVar4 = (QWidget *)&pQVar3->extra;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36260f);
  if ((bVar1) &&
     (pQVar5 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36261f),
     pQVar5->proxyWidget != (QGraphicsProxyWidget *)0x0)) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x362630);
    QGraphicsItem::clearFocus((QGraphicsItem *)0x36263d);
  }
  bVar1 = hasFocus(pQVar4);
  if (bVar1) {
    QApplicationPrivate::setFocusWidget(in_stack_ffffffffffffff88,reason);
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_40,&in_RDI->super_QObject,Focus);
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::clearFocus()
{
    if (hasFocus()) {
        if (testAttribute(Qt::WA_InputMethodEnabled))
            QGuiApplication::inputMethod()->commit();

        QFocusEvent focusAboutToChange(QEvent::FocusAboutToChange);
        QCoreApplication::sendEvent(this, &focusAboutToChange);
    }

    QTLWExtra *extra = window()->d_func()->maybeTopData();
    QObject *originalFocusObject = nullptr;
    if (extra && extra->window) {
        originalFocusObject = extra->window->focusObject();
        // the window's focus object might already be nullptr if we are in the destructor, but we still
        // need to update QGuiApplication and input context if we have a focus widget.
        if (!originalFocusObject)
            originalFocusObject = focusWidget();
    }

    QWidget *w = this;
    while (w) {
        // Just like setFocus(), we update (clear) the focus_child of our parents
        if (w->d_func()->focus_child == this)
            w->d_func()->focus_child = nullptr;
        w = w->parentWidget();
    }

    // We've potentially cleared the focus_child of our parents, so we need
    // to report this to the rest of Qt. Note that the focus_child is not the same
    // thing as the application's focusWidget, which is why this piece of code is
    // not inside a hasFocus() block.
    if (originalFocusObject && originalFocusObject != extra->window->focusObject())
        emit extra->window->focusObjectChanged(extra->window->focusObject());

#if QT_CONFIG(graphicsview)
    const auto &topData = d_func()->extra;
    if (topData && topData->proxyWidget)
        topData->proxyWidget->clearFocus();
#endif

    if (hasFocus()) {
        // Update proxy state
        QApplicationPrivate::setFocusWidget(nullptr, Qt::OtherFocusReason);
#if QT_CONFIG(accessibility)
        QAccessibleEvent event(this, QAccessible::Focus);
        QAccessible::updateAccessibility(&event);
#endif
    }
}